

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O2

void __thiscall clunk::Node::GetSliderChecks<true>(Node *this)

{
  byte bVar1;
  char cVar2;
  MoveType MVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  uint64_t mvs;
  uint from;
  ulong uVar14;
  uint from_00;
  uint to;
  ulong uVar15;
  uint uVar16;
  ulong uVar18;
  ulong uVar17;
  
  bVar1 = _KING[1];
  if ((bVar1 & 0x88) != 0) {
    __assert_fail("IS_SQUARE(king)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x722,"void clunk::Node::GetSliderChecks() [color = true]");
  }
  if ((undefined *)(&_board)[bVar1] != _KING) {
    __assert_fail("_board[king] == _KING[!color]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x723,"void clunk::Node::GetSliderChecks() [color = true]");
  }
  uVar15 = (&_queenKing)[bVar1];
  do {
    if (uVar15 == 0) {
      return;
    }
    if ((uVar15 & 0xff) == 0) {
      __assert_fail("mvs & 0xFF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x728,"void clunk::Node::GetSliderChecks() [color = true]");
    }
    to = (int)(uVar15 & 0xff) - 1;
    from = (uint)bVar1;
    iVar4 = Direction(from,to);
    uVar16 = iVar4 + 0x11;
    uVar17 = (ulong)uVar16;
    if ((0x22 < uVar16) || ((0x700050007U >> (uVar17 & 0x3f) & 1) == 0)) {
      __assert_fail("IS_DIR(dir)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x72b,"void clunk::Node::GetSliderChecks() [color = true]");
    }
    do {
      from = iVar4 + from;
      if ((from & 0xffffff88) != 0) {
        __assert_fail("IS_SQUARE(to)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x72d,"void clunk::Node::GetSliderChecks() [color = true]");
      }
      iVar5 = Direction((uint)bVar1,from);
      if (iVar5 != iVar4) {
        __assert_fail("Direction(king, to) == dir",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x72e,"void clunk::Node::GetSliderChecks() [color = true]");
      }
      uVar13 = (ulong)from;
      for (uVar18 = *(ulong *)(_atk + uVar13 * 8); uVar18 != 0; uVar18 = uVar18 >> 8) {
        if ((uVar18 & 0xff) != 0) {
          from_00 = (int)(uVar18 & 0xff) - 1;
          if ((from_00 & 0xffffff88) != 0) {
            __assert_fail("IS_SQUARE(from)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x732,"void clunk::Node::GetSliderChecks() [color = true]");
          }
          uVar14 = (ulong)from_00;
          if ((char *)(&_board)[uVar14] < _FIRST_SLIDER) {
            __assert_fail("_board[from] >= _FIRST_SLIDER",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x733,"void clunk::Node::GetSliderChecks() [color = true]");
          }
          cVar2 = *(char *)(&_board)[uVar14];
          if (5 < (byte)(cVar2 - 6U)) {
            __assert_fail("IS_SLIDER(_board[from]->type)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x734,"void clunk::Node::GetSliderChecks() [color = true]");
          }
          if (cVar2 == '\v') {
            iVar5 = Direction(from_00,from);
            iVar6 = Direction(from_00,from);
            iVar7 = Direction(from_00,from);
            iVar8 = Direction(from_00,from);
            iVar9 = Direction(from_00,from);
            iVar10 = Direction(from_00,from);
            iVar11 = Direction(from_00,from);
            iVar12 = Direction(from_00,from);
            if ((((((iVar5 != -0x11) && (iVar6 != -0xf)) && (iVar7 != 0xf)) &&
                 ((iVar8 != 0x11 && (iVar9 != -0x10)))) && (iVar10 != -1)) &&
               ((iVar11 != 1 && (iVar12 != 0x10)))) {
              __assert_fail("IS_DIR(Direction(from, to))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x759,"void clunk::Node::GetSliderChecks() [color = true]");
            }
            if ((undefined *)(&_board)[uVar13] == _EMPTY) {
              iVar5 = GetPinDir(this,true,from_00);
              if (iVar5 != 0) {
                iVar7 = Direction(from_00,from);
                iVar6 = -iVar7;
                if (0 < iVar7) {
                  iVar6 = iVar7;
                }
                if (iVar6 != iVar5) goto LAB_0012ec23;
              }
              iVar5 = *(int *)(_SQR + uVar13 * 4) - *(int *)(_SQR + uVar14 * 4);
              MVar3 = QueenMove;
LAB_0012ebd4:
              AddMove(this,MVar3,from_00,from,iVar5,0,0);
            }
            else {
              iVar5 = Direction(from,from_00);
              if (iVar5 == iVar4) {
                if (*(char *)(&_board)[uVar13] == '\t') {
                  if ((uVar16 < 0x23) && ((0x500000005U >> (uVar17 & 0x3f) & 1) != 0))
                  goto LAB_0012ec00;
                }
                else if ((*(char *)(&_board)[uVar13] == '\a') &&
                        ((iVar4 + 0x10U < 0x21 &&
                         ((0x100028001U >> ((ulong)(iVar4 + 0x10U) & 0x3f) & 1) != 0))))
                goto LAB_0012ea73;
              }
            }
          }
          else if (cVar2 == '\t') {
            iVar5 = Direction(from_00,from);
            iVar6 = Direction(from_00,from);
            iVar7 = Direction(from_00,from);
            iVar8 = Direction(from_00,from);
            if ((((iVar5 != -0x10) && (iVar6 != -1)) && (iVar7 != 1)) && (iVar8 != 0x10)) {
              __assert_fail("IS_CROSS(Direction(from, to))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x748,"void clunk::Node::GetSliderChecks() [color = true]");
            }
            if ((undefined *)(&_board)[uVar13] == _EMPTY) {
              if ((iVar4 + 0x10U < 0x21) &&
                 ((0x100028001U >> ((ulong)(iVar4 + 0x10U) & 0x3f) & 1) != 0)) {
                iVar5 = GetPinDir(this,true,from_00);
                if (iVar5 != 0) {
                  iVar7 = Direction(from_00,from);
                  iVar6 = -iVar7;
                  if (0 < iVar7) {
                    iVar6 = iVar7;
                  }
                  if (iVar6 != iVar5) goto LAB_0012ec23;
                }
                iVar5 = *(int *)(_SQR + uVar13 * 4) - *(int *)(_SQR + uVar14 * 4);
                MVar3 = RookMove;
                goto LAB_0012ebd4;
              }
            }
            else {
              iVar5 = Direction(from,from_00);
              if ((iVar5 == iVar4) && (*(char *)(&_board)[uVar13] == '\a')) {
LAB_0012ea73:
                mvs = (&_bishopRook)[uVar13];
                MVar3 = BishopMove;
LAB_0012ec1a:
                GetSliderDiscovers(this,true,MVar3,mvs,from);
              }
            }
          }
          else if (cVar2 == '\a') {
            iVar5 = Direction(from_00,from);
            iVar6 = Direction(from_00,from);
            iVar7 = Direction(from_00,from);
            iVar8 = Direction(from_00,from);
            if ((((iVar5 != -0x11) && (iVar6 != -0xf)) && (iVar7 != 0xf)) && (iVar8 != 0x11)) {
              __assert_fail("IS_DIAG(Direction(from, to))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x737,"void clunk::Node::GetSliderChecks() [color = true]");
            }
            if ((undefined *)(&_board)[uVar13] == _EMPTY) {
              if ((uVar16 < 0x23) && ((0x500000005U >> (uVar17 & 0x3f) & 1) != 0)) {
                iVar5 = GetPinDir(this,true,from_00);
                if (iVar5 != 0) {
                  iVar7 = Direction(from_00,from);
                  iVar6 = -iVar7;
                  if (0 < iVar7) {
                    iVar6 = iVar7;
                  }
                  if (iVar6 != iVar5) goto LAB_0012ec23;
                }
                iVar5 = *(int *)(_SQR + uVar13 * 4) - *(int *)(_SQR + uVar14 * 4);
                MVar3 = BishopMove;
                goto LAB_0012ebd4;
              }
            }
            else {
              iVar5 = Direction(from,from_00);
              if ((iVar5 == iVar4) && (*(char *)(&_board)[uVar13] == '\t')) {
LAB_0012ec00:
                mvs = (&_bishopRook)[from | 8];
                MVar3 = RookMove;
                goto LAB_0012ec1a;
              }
            }
          }
        }
LAB_0012ec23:
      }
    } while ((from != to) && ((undefined *)(&_board)[uVar13] == _EMPTY));
    uVar15 = uVar15 >> 8;
  } while( true );
}

Assistant:

void GetSliderChecks() {
    const int king = _KING[!color]->sqr;
    assert(IS_SQUARE(king));
    assert(_board[king] == _KING[!color]);

    int score;
    int pinDir;
    for (uint64_t mvs = _queenKing[king]; mvs; mvs >>= 8) {
      assert(mvs & 0xFF);
      const int end = ((mvs & 0xFF) - 1);
      const int dir = Direction(king, end);
      assert(IS_DIR(dir));
      for (int to = (king + dir);; to += dir) {
        assert(IS_SQUARE(to));
        assert(Direction(king, to) == dir);
        for (uint64_t tmp = _atk[to]; tmp; tmp >>= 8) {
          if (tmp & 0xFF) {
            const int from = ((tmp & 0xFF) - 1);
            assert(IS_SQUARE(from));
            assert(_board[from] >= _FIRST_SLIDER);
            assert(IS_SLIDER(_board[from]->type));
            switch (_board[from]->type) {
            case (color|Bishop):
              assert(IS_DIAG(Direction(from, to)));
              if (_board[to] == _EMPTY) {
                if (IS_DIAG(dir)) {
                  pinDir = GetPinDir(color, from);
                  if (!pinDir || (abs(Direction(from, to)) == pinDir)) {
                    score = (_SQR[to] - _SQR[from]);
                    AddMove(BishopMove, from, to, score);
                  }
                }
              }
              else if ((Direction(to, from) == dir) &
                       (_board[to]->type == (color|Rook)))
              {
                GetSliderDiscovers(color, RookMove, _bishopRook[to + 8], to);
              }
              break;
            case (color|Rook):
              assert(IS_CROSS(Direction(from, to)));
              if (_board[to] == _EMPTY) {
                if (IS_CROSS(dir)) {
                  pinDir = GetPinDir(color, from);
                  if (!pinDir || (abs(Direction(from, to)) == pinDir)) {
                    score = (_SQR[to] - _SQR[from]);
                    AddMove(RookMove, from, to, score);
                  }
                }
              }
              else if ((Direction(to, from) == dir) &
                       (_board[to]->type == (color|Bishop)))
              {
                GetSliderDiscovers(color, BishopMove, _bishopRook[to], to);
              }
              break;
            case (color|Queen):
              assert(IS_DIR(Direction(from, to)));
              if (_board[to] == _EMPTY) {
                pinDir = GetPinDir(color, from);
                if (!pinDir || (abs(Direction(from, to)) == pinDir)) {
                  score = (_SQR[to] - _SQR[from]);
                  AddMove(QueenMove, from, to, score);
                }
              }
              else if (Direction(to, from) == dir) {
                switch (_board[to]->type) {
                case (color|Bishop):
                  if (IS_CROSS(dir)) {
                    GetSliderDiscovers(color, BishopMove, _bishopRook[to], to);
                  }
                  break;
                case (color|Rook):
                  if (IS_DIAG(dir)) {
                    GetSliderDiscovers(color, RookMove, _bishopRook[to + 8], to);
                  }
                  break;
                }
              }
              break;
            }
          }
        }
        if ((to == end) | (_board[to] != _EMPTY)) {
          break;
        }
      }
    }
  }